

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_nuniformuiv(NegativeTestContext *ctx)

{
  undefined *puVar1;
  bool bVar2;
  deBool dVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar4;
  RenderContext *pRVar5;
  NotSupportedError *this;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  GLsizei local_274;
  GLuint local_270;
  GLsizei bufferSize;
  GLuint programEmpty;
  GLuint shader;
  GLuint params [4];
  GLint unif;
  string local_230;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  ProgramSources local_1c8;
  undefined1 local_f8 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    pRVar5 = NegativeTestContext::getRenderContext(ctx);
    ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
    requiredApiType = glu::ApiType::es(3,2);
    bVar2 = glu::contextSupports(ctxType,requiredApiType);
    if (!bVar2) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pRVar5 = NegativeTestContext::getRenderContext(ctx);
      puVar1 = uniformTestVertSource;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,puVar1,&local_209);
      getVtxFragVersionSources(&local_1e8,&local_208,ctx);
      puVar1 = uniformTestFragSource;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&unif,puVar1,(allocator<char> *)((long)params + 0xf));
      getVtxFragVersionSources(&local_230,(string *)&unif,ctx);
      glu::makeVtxFragSources(&local_1c8,&local_1e8,&local_230);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,pRVar5,&local_1c8);
      glu::ProgramSources::~ProgramSources(&local_1c8);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&unif);
      std::allocator<char>::~allocator((allocator<char> *)((long)params + 0xf));
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
      params[2] = glu::CallLogWrapper::glGetUniformLocation
                            (&ctx->super_CallLogWrapper,dVar4,"fUnif_ivec4");
      _programEmpty = 0;
      params[0] = 0;
      params[1] = 0;
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
      glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,dVar4);
      if (params[2] == 0xffffffff) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"Failed to retrieve uniform location",&local_299);
        NegativeTestContext::fail(ctx,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator(&local_299);
      }
      bufferSize = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
      local_270 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
      glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8a2e,&local_274);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,
                 "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
                 &local_2c1);
      NegativeTestContext::beginSection(ctx,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      glu::CallLogWrapper::glGetnUniformuiv
                (&ctx->super_CallLogWrapper,0xffffffff,params[2],local_274,&programEmpty);
      NegativeTestContext::expectError(ctx,0x501);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,
                 "GL_INVALID_OPERATION is generated if program is not a program object.",&local_2e9)
      ;
      NegativeTestContext::beginSection(ctx,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      glu::CallLogWrapper::glGetnUniformuiv
                (&ctx->super_CallLogWrapper,bufferSize,params[2],local_274,&programEmpty);
      NegativeTestContext::expectError(ctx,0x502);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,
                 "GL_INVALID_OPERATION is generated if program has not been successfully linked.",
                 &local_311);
      NegativeTestContext::beginSection(ctx,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
      glu::CallLogWrapper::glGetnUniformuiv
                (&ctx->super_CallLogWrapper,local_270,params[2],local_274,&programEmpty);
      NegativeTestContext::expectError(ctx,0x502);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,
                 "GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object."
                 ,&local_339);
      NegativeTestContext::beginSection(ctx,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator(&local_339);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
      glu::CallLogWrapper::glGetnUniformuiv
                (&ctx->super_CallLogWrapper,dVar4,-1,local_274,&programEmpty);
      NegativeTestContext::expectError(ctx,0x502);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,
                 "GL_INVALID_OPERATION is generated if the buffer size required to store the requested data is greater than bufSize."
                 ,&local_361);
      NegativeTestContext::beginSection(ctx,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator(&local_361);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
      glu::CallLogWrapper::glGetnUniformuiv
                (&ctx->super_CallLogWrapper,dVar4,params[2],-1,&programEmpty);
      NegativeTestContext::expectError(ctx,0x502);
      NegativeTestContext::endSection(ctx);
      glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,bufferSize);
      glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,local_270);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x2dc);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void get_nuniformuiv (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				unif			= ctx.glGetUniformLocation(program.getProgram(), "fUnif_ivec4");
	GLuint				params[4]		= { 0, 0, 0, 0 };
	GLuint				shader;
	GLuint				programEmpty;
	GLsizei				bufferSize;

	ctx.glUseProgram(program.getProgram());

	if (unif == -1)
		ctx.fail("Failed to retrieve uniform location");

	shader = ctx.glCreateShader(GL_VERTEX_SHADER);
	programEmpty = ctx.glCreateProgram();

	ctx.glGetIntegerv(GL_MAX_COMBINED_UNIFORM_BLOCKS, &bufferSize);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetnUniformuiv(-1, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetnUniformuiv(shader, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program has not been successfully linked.");
	ctx.glGetnUniformuiv(programEmpty, unif, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object.");
	ctx.glGetnUniformuiv(program.getProgram(), -1, bufferSize, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the buffer size required to store the requested data is greater than bufSize.");
	ctx.glGetnUniformuiv(program.getProgram(), unif, -1, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(programEmpty);
}